

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::GetGeneratorDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer ppcVar1;
  pointer pbVar2;
  pointer ppcVar3;
  cmDocumentationEntry e;
  string doc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  string name;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  cmake *local_b8;
  pointer local_b0;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  ppcVar3 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = this;
  if (ppcVar3 !=
      (this->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_f8._8_8_ = 0;
      local_f8[0x10] = '\0';
      local_d0 = 0;
      local_c8._M_local_buf[0] = '\0';
      local_f8._0_8_ = local_f8 + 0x10;
      local_d8._M_p = (pointer)&local_c8;
      (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[3])(*ppcVar3,local_f8);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
                (v,(value_type *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p,
                        CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1)
        ;
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
      }
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 !=
             (local_b8->Generators).
             super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppcVar1 = (local_b8->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar1 !=
      (local_b8->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmExternalMakefileProjectGeneratorFactory::GetDocumentation_abi_cxx11_(&local_a8,*ppcVar1);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_70,*ppcVar1);
      this_00 = *ppcVar1;
      local_b0 = ppcVar1;
      for (pbVar2 = (this_00->Aliases).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 != (this_00->Aliases).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
        local_f8._0_8_ = local_f8 + 0x10;
        local_f8._8_8_ = 0;
        local_f8[0x10] = '\0';
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        local_d8._M_p = (pointer)&local_c8;
        std::__cxx11::string::_M_assign((string *)local_f8);
        std::__cxx11::string::_M_assign((string *)&local_d8);
        std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
                  (v,(value_type *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_p != &local_c8) {
          operator_delete(local_d8._M_p,
                          CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
        }
        this_00 = *local_b0;
      }
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                (&local_88,this_00);
      for (pbVar2 = local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 != local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
        local_f8._0_8_ = local_f8 + 0x10;
        local_f8._8_8_ = 0;
        local_f8[0x10] = '\0';
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        local_d8._M_p = (pointer)&local_c8;
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_50,pbVar2,&local_70);
        std::__cxx11::string::operator=((string *)local_f8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)&local_d8);
        std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
                  (v,(value_type *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_p != &local_c8) {
          operator_delete(local_d8._M_p,
                          CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      ppcVar1 = local_b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      ppcVar1 = ppcVar1 + 1;
    } while (ppcVar1 !=
             (local_b8->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmake::GetGeneratorDocumentation(std::vector<cmDocumentationEntry>& v)
{
  for (RegisteredGeneratorsVector::const_iterator i = this->Generators.begin();
       i != this->Generators.end(); ++i) {
    cmDocumentationEntry e;
    (*i)->GetDocumentation(e);
    v.push_back(e);
  }
  for (RegisteredExtraGeneratorsVector::const_iterator i =
         this->ExtraGenerators.begin();
       i != this->ExtraGenerators.end(); ++i) {
    const std::string doc = (*i)->GetDocumentation();
    const std::string name = (*i)->GetName();

    // Aliases:
    for (std::vector<std::string>::const_iterator a = (*i)->Aliases.begin();
         a != (*i)->Aliases.end(); ++a) {
      cmDocumentationEntry e;
      e.Name = *a;
      e.Brief = doc;
      v.push_back(e);
    }

    // Full names:
    const std::vector<std::string> generators =
      (*i)->GetSupportedGlobalGenerators();
    for (std::vector<std::string>::const_iterator g = generators.begin();
         g != generators.end(); ++g) {
      cmDocumentationEntry e;
      e.Name =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(*g, name);
      e.Brief = doc;
      v.push_back(e);
    }
  }
}